

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::LargeHeapBlock::SweepObjects<(Memory::SweepMode)2>(LargeHeapBlock *this,Recycler *recycler)

{
  size_t *psVar1;
  undefined4 *puVar2;
  size_t size;
  LargeHeapBlockFreeListEntry *pLVar3;
  code *pcVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  BOOL BVar8;
  LargeObjectHeader *pLVar9;
  uint uVar10;
  Recycler *recycler_00;
  uint i;
  uint index;
  undefined8 *in_FS_OFFSET;
  uint local_34;
  
  if ((this->super_HeapBlock).isPendingConcurrentSweep == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x7ac,"(mode == SweepMode_InThread || this->isPendingConcurrentSweep)",
                       "mode == SweepMode_InThread || this->isPendingConcurrentSweep");
    if (!bVar5) goto LAB_0026b7fa;
    *puVar2 = 0;
  }
  uVar7 = GetMarkCount(this);
  uVar10 = this->expectedSweepCount;
  if (uVar10 != this->allocCount - uVar7) {
    BVar8 = Recycler::IsConcurrentSweepState(recycler);
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x7b7,
                         "(expectedSweepCount == allocCount - markCount || recycler->IsConcurrentSweepState())"
                         ,
                         "expectedSweepCount == allocCount - markCount || recycler->IsConcurrentSweepState()"
                        );
      if (!bVar5) goto LAB_0026b7fa;
      *puVar2 = 0;
    }
    uVar10 = this->expectedSweepCount;
  }
  if ((uVar10 == 0) && ((this->super_HeapBlock).isForceSweeping == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x7bb,"(expectedSweepCount != 0 || isForceSweeping)",
                       "expectedSweepCount != 0 || isForceSweeping");
    if (!bVar5) goto LAB_0026b7fa;
    *puVar2 = 0;
  }
  puVar2 = (undefined4 *)*in_FS_OFFSET;
  local_34 = 0;
  for (index = 0; index < this->lastCollectAllocCount; index = index + 1) {
    psVar1 = &(recycler->collectionStats).objectSweepScanCount;
    *psVar1 = *psVar1 + ((ulong)(this->super_HeapBlock).isForceSweeping ^ 1);
    pLVar9 = GetHeaderByIndex(this,index);
    if (pLVar9 == (LargeObjectHeader *)0x0) {
      uVar10 = this->expectedSweepCount;
      if (uVar10 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x7c6,"(expectedSweepCount != 0)","expectedSweepCount != 0");
        if (!bVar5) goto LAB_0026b7fa;
        *puVar2 = 0;
        uVar10 = this->expectedSweepCount;
      }
      this->expectedSweepCount = uVar10 - 1;
      if (recycler->recyclerFlagsTable->Verbose == true) {
        bVar5 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase);
        if (!bVar5) {
          bVar5 = Js::Phases::IsEnabled
                            (&recycler->recyclerFlagsTable->Trace,LargeMemoryAllocationPhase);
          if (!bVar5) goto LAB_0026b794;
        }
        Output::Print(L"Index %d empty\n",(ulong)index);
      }
    }
    else {
      if (index != pLVar9->objectIndex) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,1999,"(header->objectIndex == i)","header->objectIndex == i");
        if (!bVar5) goto LAB_0026b7fa;
        *puVar2 = 0;
      }
      recycler_00 = (Recycler *)(pLVar9 + 1);
      bVar5 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,recycler_00);
      if (bVar5) {
        bVar6 = LargeObjectHeader::GetAttributes(pLVar9,recycler->Cookie);
        if ((bVar6 & 4) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar2 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                             ,0x7d6,"((attributes & NewFinalizeBit) == 0)",
                             "(attributes & NewFinalizeBit) == 0");
          if (!bVar5) goto LAB_0026b7fa;
          *puVar2 = 0;
        }
        pLVar9 = GetHeaderByIndex(this,index);
        psVar1 = &(recycler->collectionStats).largeHeapBlockUsedByteCount;
        *psVar1 = *psVar1 + pLVar9->objectSize;
      }
      else {
        size = pLVar9->objectSize;
        Recycler::NotifyFree(recycler,(char *)recycler_00,size);
        SweepObject<(Memory::SweepMode)2>(this,recycler_00,pLVar9);
        if ((this->bucket->supportFreeList == true) &&
           ((this->super_HeapBlock).isForceSweeping == false)) {
          pLVar3 = (this->freeList).entries;
          pLVar9->objectIndex = index;
          pLVar9->next = (LargeObjectHeader *)this;
          *(LargeHeapBlockFreeListEntry **)&pLVar9->attributesAndChecksum = pLVar3;
          pLVar9->objectSize = size;
          (this->freeList).entries = (LargeHeapBlockFreeListEntry *)pLVar9;
        }
        local_34 = local_34 + 1;
      }
    }
LAB_0026b794:
  }
  if (local_34 != this->expectedSweepCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x7f6,"(sweepCount == expectedSweepCount)",
                       "sweepCount == expectedSweepCount");
    if (!bVar5) {
LAB_0026b7fa:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  (this->super_HeapBlock).isPendingConcurrentSweep = false;
  return;
}

Assistant:

void
LargeHeapBlock::SweepObjects(Recycler * recycler)
{
#if ENABLE_CONCURRENT_GC
    Assert(mode == SweepMode_InThread || this->isPendingConcurrentSweep);
#else
    Assert(mode == SweepMode_InThread);
#endif

    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;
#if DBG
    uint markCount = GetMarkCount();

    // mark count included newly allocated objects
#if ENABLE_CONCURRENT_GC
    Assert(expectedSweepCount == allocCount - markCount || recycler->IsConcurrentSweepState());
#else
    Assert(expectedSweepCount == allocCount - markCount);
#endif
    Assert(expectedSweepCount != 0 || isForceSweeping);
    uint sweepCount = 0;
#endif

    for (uint i = 0; i < lastCollectAllocCount; i++)
    {
        RECYCLER_STATS_ADD(recycler, objectSweepScanCount, !isForceSweeping);
        LargeObjectHeader * header = this->GetHeaderByIndex(i);
        if (header == nullptr)
        {
#if DBG
            Assert(expectedSweepCount != 0);
            expectedSweepCount--;
#endif
#if DBG
            LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Index %d empty\n"), i);
#endif
            continue;
        }

        Assert(header->objectIndex == i);

        // Skip sweep if the object is alive
        if (heapBlockMap.IsMarked(header->GetAddress()))
        {
#if DBG
            unsigned char attributes = header->GetAttributes(recycler->Cookie);
            Assert((attributes & NewFinalizeBit) == 0);
#endif

            RECYCLER_STATS_ADD(recycler, largeHeapBlockUsedByteCount, this->GetHeaderByIndex(i)->objectSize);
            continue;
        }

        size_t objectSize = header->objectSize;
        recycler->NotifyFree((char *)header->GetAddress(), objectSize);

        SweepObject<mode>(recycler, header);

        if (this->bucket->SupportFreeList()
#ifdef RECYCLER_STATS
            && !isForceSweeping
#endif
            )
        {
            LargeHeapBlockFreeListEntry* head = this->freeList.entries;
            LargeHeapBlockFreeListEntry* entry = (LargeHeapBlockFreeListEntry*) header;
            entry->headerIndex = i;
            entry->heapBlock = this;
            entry->next = head;
            entry->objectSize = objectSize;
            this->freeList.entries = entry;
        }

#if DBG
        sweepCount++;
#endif
    }

    Assert(sweepCount == expectedSweepCount);
#if ENABLE_CONCURRENT_GC
    this->isPendingConcurrentSweep = false;
#endif
}